

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O1

void glcts::TessellationShadersIsolines::checkFirstOuterTessellationLevelEffect
               (_test_result *test_result,GLenum glMaxTessGenLevelToken)

{
  ostringstream *this;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  GLint gl_max_tess_gen_level_value;
  float outer_zero_tess_level_clamped_rounded;
  GLint local_1a8;
  float local_1a4;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar1 = (*((test_result->parent->parent->super_TestCaseBase).m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_1a8 = 0;
  if (test_result->n_vertices != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(glMaxTessGenLevelToken,&local_1a8);
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0x50);
    local_1a4 = 0.0;
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,test_result->parent->outer_tess_levels[0],
               local_1a8,(float *)0x0,&local_1a4);
    if (test_result->n_isolines != (uint)(long)local_1a4) {
      local_1a0._0_8_ =
           ((test_result->parent->parent->super_TestCaseBase).super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      this = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"Tessellator generated an invalid amount of isolines:",0x34);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this," instead of the expected amount:",0x20);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this," for the following inner tessellation level configuration:",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," (",2);
      std::ostream::_M_insert<double>((double)test_result->parent->inner_tess_levels[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::_M_insert<double>((double)test_result->parent->inner_tess_levels[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,")",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this," and the following outer tesellation level configuration:",0x39);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," (",2);
      std::ostream::_M_insert<double>((double)test_result->parent->outer_tess_levels[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::_M_insert<double>((double)test_result->parent->outer_tess_levels[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::_M_insert<double>((double)test_result->parent->outer_tess_levels[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::_M_insert<double>((double)test_result->parent->outer_tess_levels[3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base(local_128);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid amount of isolines generated by tessellator",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                 ,0x6e);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void TessellationShadersIsolines::checkFirstOuterTessellationLevelEffect(_test_result&	 test_result,
																		 const glw::GLenum glMaxTessGenLevelToken)
{
	glcts::Context&		  context					  = test_result.parent->parent->getContext();
	const glw::Functions& gl						  = context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;
	unsigned int		  n_isolines_expected		  = 0;

	if (test_result.n_vertices != 0)
	{
		/* Calculate how many isolines we're expecting */
		gl.getIntegerv(glMaxTessGenLevelToken, &gl_max_tess_gen_level_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

		/* NOTE: Amount of isolines should always be based on TESSELLATION_SHADER_VERTEX_SPACING_EQUAL
		 *       vertex spacing mode, even if a different one is defined in TE stage.
		 */
		float outer_zero_tess_level_clamped_rounded = 0.0f;

		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, test_result.parent->outer_tess_levels[0],
			gl_max_tess_gen_level_value, DE_NULL, /* out_clamped */
			&outer_zero_tess_level_clamped_rounded);

		n_isolines_expected = (unsigned int)outer_zero_tess_level_clamped_rounded;

		if (test_result.n_isolines != n_isolines_expected)
		{
			tcu::TestContext& test = test_result.parent->parent->getTestContext();

			test.getLog() << tcu::TestLog::Message
						  << "Tessellator generated an invalid amount of isolines:" << test_result.n_isolines
						  << " instead of the expected amount:" << n_isolines_expected
						  << " for the following inner tessellation level configuration:"
						  << " (" << test_result.parent->inner_tess_levels[0] << ", "
						  << test_result.parent->inner_tess_levels[1] << ")"
						  << " and the following outer tesellation level configuration:"
						  << " (" << test_result.parent->outer_tess_levels[0] << ", "
						  << test_result.parent->outer_tess_levels[1] << ", "
						  << test_result.parent->outer_tess_levels[2] << ", "
						  << test_result.parent->outer_tess_levels[3] << ")" << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid amount of isolines generated by tessellator");
		}
	} /* if (test_run.n_vertices != 0) */
}